

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O0

int pt_insn_at_skl014(pt_event *ev,pt_insn *insn,pt_insn_ext *iext,pt_config *config)

{
  int status;
  uint64_t ip;
  pt_config *config_local;
  pt_insn_ext *iext_local;
  pt_insn *insn_local;
  pt_event *ev_local;
  
  if ((((ev == (pt_event *)0x0) || (insn == (pt_insn *)0x0)) || (iext == (pt_insn_ext *)0x0)) ||
     (config == (pt_config *)0x0)) {
    ev_local._4_4_ = -1;
  }
  else if ((ev->field_0x4 & 1) == 0) {
    ev_local._4_4_ = 0;
  }
  else if (((insn->iclass == ptic_call) || (insn->iclass == ptic_jump)) &&
          (((iext->variant).branch.is_direct != '\0' &&
           (ev_local._4_4_ =
                 pt_filter_addr_check
                           (&config->addr_filter,
                            (long)(iext->variant).branch.displacement + (ulong)insn->size + insn->ip
                           ), ev_local._4_4_ < 1)))) {
    if (-1 < ev_local._4_4_) {
      ev_local._4_4_ = 1;
    }
  }
  else {
    ev_local._4_4_ = 0;
  }
  return ev_local._4_4_;
}

Assistant:

static int pt_insn_at_skl014(const struct pt_event *ev,
			     const struct pt_insn *insn,
			     const struct pt_insn_ext *iext,
			     const struct pt_config *config)
{
	uint64_t ip;
	int status;

	if (!ev || !insn || !iext || !config)
		return -pte_internal;

	if (!ev->ip_suppressed)
		return 0;

	switch (insn->iclass) {
	case ptic_call:
	case ptic_jump:
		/* The erratum only applies to unconditional direct branches. */
		if (!iext->variant.branch.is_direct)
			break;

		/* Check the filter against the branch target. */
		ip = insn->ip;
		ip += insn->size;
		ip += (uint64_t) (int64_t) iext->variant.branch.displacement;

		status = pt_filter_addr_check(&config->addr_filter, ip);
		if (status <= 0) {
			if (status < 0)
				return status;

			return 1;
		}
		break;

	default:
		break;
	}

	return 0;
}